

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto.cc
# Opt level: O3

bool __thiscall
absl::lts_20240722::log_internal::EncodeVarint
          (log_internal *this,uint64_t tag,uint64_t value,Span<char> *buf)

{
  ulong uVar1;
  bool bVar2;
  Span<char> *pSVar3;
  uint64_t value_00;
  Span<char> *this_00;
  uint64_t value_01;
  
  this_00 = (Span<char> *)((long)this << 3);
  value_01 = 1;
  value_00 = 1;
  pSVar3 = this_00;
  if ((Span<char> *)0x7f < this_00) {
    do {
      buf = (Span<char> *)((ulong)pSVar3 >> 7);
      value_00 = value_00 + 1;
      bVar2 = (Span<char> *)0x3fff < pSVar3;
      pSVar3 = buf;
    } while (bVar2);
  }
  if (0x7f < tag) {
    value_01 = 1;
    pSVar3 = (Span<char> *)tag;
    do {
      buf = (Span<char> *)((ulong)pSVar3 >> 7);
      value_01 = value_01 + 1;
      bVar2 = (Span<char> *)0x3fff < pSVar3;
      pSVar3 = buf;
    } while (bVar2);
  }
  uVar1 = *(ulong *)(value + 8);
  if (uVar1 < value_01 + value_00) {
    *(undefined8 *)(value + 8) = 0;
  }
  else {
    anon_unknown_1::EncodeRawVarint((anon_unknown_1 *)this_00,value_00,value,buf);
    anon_unknown_1::EncodeRawVarint((anon_unknown_1 *)tag,value_01,value,buf);
  }
  return value_01 + value_00 <= uVar1;
}

Assistant:

bool EncodeVarint(uint64_t tag, uint64_t value, absl::Span<char> *buf) {
  const uint64_t tag_type = MakeTagType(tag, WireType::kVarint);
  const size_t tag_type_size = VarintSize(tag_type);
  const size_t value_size = VarintSize(value);
  if (tag_type_size + value_size > buf->size()) {
    buf->remove_suffix(buf->size());
    return false;
  }
  EncodeRawVarint(tag_type, tag_type_size, buf);
  EncodeRawVarint(value, value_size, buf);
  return true;
}